

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O3

void emit_rma(ASMState *as,x86Op xo,Reg rr,void *addr)

{
  MCode *pMVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  
  pMVar1 = as->mcp;
  *(int *)(pMVar1 + -4) = (int)addr;
  pMVar1[-5] = '%';
  pMVar1[-6] = (char)rr * '\b' & 0x38U | 4;
  *(x86Op *)(pMVar1 + -10) = xo;
  lVar5 = (long)(char)xo;
  pbVar2 = pMVar1 + lVar5 + -5;
  uVar4 = rr >> 1 & 0x104;
  if (uVar4 != 0) {
    bVar3 = (byte)(rr >> 0x10) | (byte)uVar4 | 0x40;
    if ((xo & XI_GROUP5) == 0xfc) {
      *pbVar2 = bVar3;
      bVar3 = (byte)(xo >> 8);
    }
    else if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar2 = bVar3;
      bVar3 = 0x66;
    }
    pMVar1[lVar5 + -6] = bVar3;
    pbVar2 = pMVar1 + lVar5 + -6;
  }
  as->mcp = pbVar2;
  return;
}

Assistant:

static void emit_rma(ASMState *as, x86Op xo, Reg rr, const void *addr)
{
  MCode *p = as->mcp;
  *(int32_t *)(p-4) = ptr2addr(addr);
#if LJ_64
  p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
  as->mcp = emit_opm(xo, XM_OFS0, rr, RID_ESP, p, -5);
#else
  as->mcp = emit_opm(xo, XM_OFS0, rr, RID_EBP, p, -4);
#endif
}